

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

char_type * __thiscall
booster::locale::gnu_gettext::mo_message<char>::get
          (mo_message<char> *this,int domain_id,char_type *context,char_type *single_id,int n)

{
  bool bVar1;
  uint uVar2;
  __shared_ptr *this_00;
  element_type *peVar3;
  int in_ESI;
  __shared_ptr_access<booster::locale::gnu_gettext::lambda::plural,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RDI;
  uint in_R8D;
  pair_type pVar4;
  int i;
  char *p;
  int form;
  pair_type ptr;
  char_type *in_stack_00000078;
  char_type *in_stack_00000080;
  int in_stack_0000008c;
  mo_message<char> *in_stack_00000090;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  int local_54;
  undefined4 in_stack_ffffffffffffffb8;
  int *__first;
  int *local_38;
  int *local_8;
  
  pVar4 = get_string(in_stack_00000090,in_stack_0000008c,in_stack_00000080,in_stack_00000078);
  __first = (int *)pVar4.first;
  if (__first == (int *)0x0) {
    local_8 = (int *)0x0;
  }
  else {
    this_00 = (__shared_ptr *)
              std::
              vector<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
              ::at((vector<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
                    *)in_RDI,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      std::
      vector<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
      ::operator[]((vector<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
                    *)(in_RDI + 0x40),(long)in_ESI);
      peVar3 = std::
               __shared_ptr_access<booster::locale::gnu_gettext::lambda::plural,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_RDI);
      uVar2 = (**peVar3->_vptr_plural)(peVar3,(ulong)in_R8D);
    }
    else {
      uVar2 = (uint)(in_R8D != 1);
    }
    local_54 = 0;
    for (local_8 = __first; local_38 = (int *)pVar4.second,
        local_8 < local_38 && local_54 < (int)uVar2; local_8 = (int *)((long)local_8 + 1)) {
      local_8 = (int *)std::find<char_const*,int>
                                 ((char *)__first,(char *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),
                                  local_8);
      if (local_8 == local_38) {
        return (char_type *)0x0;
      }
      local_54 = local_54 + 1;
    }
    if (local_38 <= local_8) {
      local_8 = (int *)0x0;
    }
  }
  return (char_type *)local_8;
}

Assistant:

virtual char_type const *get(int domain_id,char_type const *context,char_type const *single_id,int n) const
                {
                    pair_type ptr = get_string(domain_id,context,single_id);
                    if(!ptr.first)
                        return 0;
                    int form=0;
                    if(plural_forms_.at(domain_id)) 
                        form = (*plural_forms_[domain_id])(n);
                    else
                        form = n == 1 ? 0 : 1; // Fallback to english plural form

                    CharType const *p=ptr.first;
                    for(int i=0;p < ptr.second && i<form;i++) {
                        p=std::find(p,ptr.second,0);
                        if(p==ptr.second)
                            return 0;
                        ++p;
                    }
                    if(p>=ptr.second)
                        return 0;
                    return p;
                }